

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addBufferOperations(GLES2ThreadedSharingTest *this)

{
  value_type pEVar1;
  reference ppEVar2;
  CreateShader *pCVar3;
  ShaderSource *pSVar4;
  ShaderCompile *pSVar5;
  CreateProgram *this_00;
  AttachShader *pAVar6;
  LinkProgram *this_01;
  CreateBuffer *this_02;
  BufferData *pBVar7;
  BufferSubData *pBVar8;
  RenderBuffer *pRVar9;
  ReadPixels *pRVar10;
  CompareData *this_03;
  DeleteBuffer *pDVar11;
  DeleteShader *pDVar12;
  DeleteProgram *this_04;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_2a0;
  undefined1 local_289;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_288;
  undefined1 local_271;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_270;
  undefined1 local_259;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_258;
  undefined1 local_241;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_240;
  undefined1 local_229;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_228;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_218;
  undefined1 local_208 [8];
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_1e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1d0;
  undefined1 local_1b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_1b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1a8;
  undefined1 local_191;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_190;
  undefined1 local_179;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_178;
  undefined1 local_161;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_160;
  undefined1 local_149;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_148;
  undefined1 local_138 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> buffer;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_120;
  undefined1 local_109;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f8;
  undefined1 local_e1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d0;
  undefined1 local_b9;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_b8;
  undefined1 local_a1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a0;
  undefined1 local_89;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_88;
  undefined1 local_71;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_70;
  char *local_60;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  undefined1 local_30 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  GLES2ThreadedSharingTest *this_local;
  
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
  if (((this->m_config).render & 1U) != 0) {
    fragmentShaderSource =
         "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
    ;
    local_60 = 
    "varying mediump vec2 v_pos;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n}\n";
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b31,
               (SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_71 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_70,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_70,fragmentShaderSource,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_71 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_70);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_89 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_88,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_88,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_89 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_88);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b30,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_a1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_a0,local_60,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_a1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_a0);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_b8);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pAVar6 = (AttachShader *)operator_new(0x88);
    local_e1 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_e0,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar6,&local_d0,&local_e0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_e1 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_e0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_d0);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pAVar6 = (AttachShader *)operator_new(0x88);
    local_109 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_f8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_108,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar6,&local_f8,&local_108,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_109 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_108);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_f8);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_01 = (LinkProgram *)operator_new(0x78);
    buffer.m_state._7_1_ = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_120,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_120,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    buffer.m_state._7_1_ = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_120);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
  ppEVar2 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar2;
  this_02 = (CreateBuffer *)operator_new(0x78);
  GLES2ThreadTest::CreateBuffer::CreateBuffer
            (this_02,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138,
             (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_02);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pBVar7 = (BufferData *)operator_new(0x90);
      local_161 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
                (&local_160,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
      GLES2ThreadTest::BufferData::BufferData
                (pBVar7,&local_160,0x8892,0x400,0x88e8,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_161 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_160);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pBVar7 = (BufferData *)operator_new(0x90);
      local_149 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
                (&local_148,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
      GLES2ThreadTest::BufferData::BufferData
                (pBVar7,&local_148,0x8892,0x400,0x88e8,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_149 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar7);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_148);
    }
  }
  if ((this->m_config).modify != 0) {
    if (((this->m_config).render & 1U) == 0) {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,1);
      pEVar1 = *ppEVar2;
      pBVar8 = (BufferSubData *)operator_new(0x90);
      local_191 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
                (&local_190,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
      GLES2ThreadTest::BufferSubData::BufferSubData
                (pBVar8,&local_190,0x8892,0x11,0x11,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_191 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_190);
    }
    else {
      ppEVar2 = std::
                vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ::operator[](&this->m_threads,0);
      pEVar1 = *ppEVar2;
      pBVar8 = (BufferSubData *)operator_new(0x90);
      local_179 = 1;
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
                (&local_178,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
      GLES2ThreadTest::BufferSubData::BufferSubData
                (pBVar8,&local_178,0x8892,0x11,0x11,(bool)((this->m_config).useFenceSync & 1),
                 (bool)((this->m_config).serverSync & 1));
      local_179 = 0;
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar8);
      de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_178);
    }
  }
  if (((this->m_config).render & 1U) != 0) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pRVar9 = (RenderBuffer *)operator_new(0x88);
    local_1b9 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_1a8,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
              (&local_1b8,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
    GLES2ThreadTest::RenderBuffer::RenderBuffer
              (pRVar9,&local_1a8,&local_1b8,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_1b9 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_1b8);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_1a8);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pRVar9 = (RenderBuffer *)operator_new(0x88);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_1d0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
              (&local_1e0,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
    GLES2ThreadTest::RenderBuffer::RenderBuffer
              (pRVar9,&local_1d0,&local_1e0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_1e0);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_1d0);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)local_208);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pRVar10 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar10,0,0,400,400,0x1908,0x1401,
               (SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar10);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pRVar10 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar10,0,0,400,400,0x1908,0x1401,(SharedPtr<tcu::ThreadUtil::DataBlock> *)local_208,
               (bool)((this->m_config).useFenceSync & 1),(bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar10);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_03 = (CompareData *)operator_new(0x58);
    local_229 = 1;
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              (&local_218,(SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::SharedPtr
              (&local_228,(SharedPtr<tcu::ThreadUtil::DataBlock> *)local_208);
    tcu::ThreadUtil::CompareData::CompareData(this_03,&local_218,&local_228);
    local_229 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_03);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr(&local_228);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr(&local_218);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)local_208);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::~SharedPtr
              ((SharedPtr<tcu::ThreadUtil::DataBlock> *)&pixels2.m_state);
  }
  if (((this->m_config).modify == 0) && (((this->m_config).render & 1U) == 0)) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar2;
    pDVar11 = (DeleteBuffer *)operator_new(0x78);
    local_259 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
              (&local_258,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
    GLES2ThreadTest::DeleteBuffer::DeleteBuffer
              (pDVar11,&local_258,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_259 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_258);
  }
  else {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar11 = (DeleteBuffer *)operator_new(0x78);
    local_241 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::SharedPtr
              (&local_240,(SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
    GLES2ThreadTest::DeleteBuffer::DeleteBuffer
              (pDVar11,&local_240,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_241 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar11);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr(&local_240);
  }
  if (((this->m_config).render & 1U) != 0) {
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar12 = (DeleteShader *)operator_new(0x78);
    local_271 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_270,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar12,&local_270,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_271 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_270);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    pDVar12 = (DeleteShader *)operator_new(0x78);
    local_289 = 1;
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::SharedPtr
              (&local_288,(SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar12,&local_288,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    local_289 = 0;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr(&local_288);
    ppEVar2 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar2;
    this_04 = (DeleteProgram *)operator_new(0x78);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
              (&local_2a0,(SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_04,&local_2a0,(bool)((this->m_config).useFenceSync & 1),
               (bool)((this->m_config).serverSync & 1));
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_04);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr(&local_2a0);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *)local_138);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)&vertexShaderSource);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)local_30);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *)&fragmentShader.m_state);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addBufferOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Buffer> buffer;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateBuffer(buffer, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::BufferData(buffer, GL_ARRAY_BUFFER, 1024, GL_DYNAMIC_DRAW, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::BufferData(buffer, GL_ARRAY_BUFFER, 1024, GL_DYNAMIC_DRAW, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::BufferSubData(buffer, GL_ARRAY_BUFFER, 17, 17, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::BufferSubData(buffer, GL_ARRAY_BUFFER, 17, 17, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::RenderBuffer(program, buffer, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderBuffer(program, buffer, m_config.useFenceSync, m_config.serverSync));

		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteBuffer(buffer, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteBuffer(buffer, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}